

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O3

void __thiscall
QPDF::pushInheritedAttributesToPage(QPDF *this,bool allow_changes,bool warn_skipped_keys)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  logic_error *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
  key_ancestors;
  string sStack_b8;
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
  local_58;
  
  if ((byte)(((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
             pushed_inherited_attributes_to_pages ^ 1U | warn_skipped_keys) == 1) {
    getAllPages(this);
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_78[0] = local_68;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"/Root","");
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&sStack_b8,(string *)&(_Var1._M_head_impl)->trailer);
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/Pages","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&sStack_b8.field_2,&sStack_b8);
    pushInheritedAttributesToPageInternal
              (this,(QPDFObjectHandle *)&sStack_b8.field_2,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                *)&local_58,allow_changes,warn_skipped_keys);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_b8.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_b8.field_2._8_8_);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_b8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_b8._M_string_length);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (local_58._M_impl.super__Rb_tree_header._M_node_count != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"key_ancestors not empty after pushing inherited attributes to pages");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    (_Var1._M_head_impl)->pushed_inherited_attributes_to_pages = true;
    (_Var1._M_head_impl)->ever_pushed_inherited_attributes_to_pages = true;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
    ::~_Rb_tree(&local_58);
  }
  return;
}

Assistant:

void
QPDF::pushInheritedAttributesToPage(bool allow_changes, bool warn_skipped_keys)
{
    // Traverse pages tree pushing all inherited resources down to the page level.

    // The record of whether we've done this is cleared by updateAllPagesCache().  If we're warning
    // for skipped keys, re-traverse unconditionally.
    if (m->pushed_inherited_attributes_to_pages && (!warn_skipped_keys)) {
        return;
    }

    // Calling getAllPages() resolves any duplicated page objects, repairs broken nodes, and detects
    // loops, so we don't have to do those activities here.
    getAllPages();

    // key_ancestors is a mapping of page attribute keys to a stack of Pages nodes that contain
    // values for them.
    std::map<std::string, std::vector<QPDFObjectHandle>> key_ancestors;
    pushInheritedAttributesToPageInternal(
        m->trailer.getKey("/Root").getKey("/Pages"),
        key_ancestors,
        allow_changes,
        warn_skipped_keys);
    if (!key_ancestors.empty()) {
        throw std::logic_error(
            "key_ancestors not empty after pushing inherited attributes to pages");
    }
    m->pushed_inherited_attributes_to_pages = true;
    m->ever_pushed_inherited_attributes_to_pages = true;
}